

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::continue_statement::continue_statement
          (continue_statement *this,source_extend *extend,wstring *id)

{
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__continue_statement_001ca720;
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)id);
  return;
}

Assistant:

explicit continue_statement(const source_extend& extend, const std::wstring& id) : statement(extend), id_(id) {}